

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyHashingShardedKVS.hpp
# Opt level: O2

optional<supermap::ByteArray<1UL>_> __thiscall
supermap::KeyHashingShardedKVS<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::
getValue(KeyHashingShardedKVS<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,
        Key<1UL> *key)

{
  size_t sVar1;
  Key<1UL> *in_RDX;
  undefined8 extraout_RDX;
  optional<supermap::ByteArray<1UL>_> oVar2;
  
  sVar1 = getShardIdForKey((KeyHashingShardedKVS<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>
                            *)key,in_RDX);
  (**(code **)(**(long **)(*(long *)(key + 8) + sVar1 * 8) + 8))(this);
  oVar2.super__Optional_base<supermap::ByteArray<1UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<1UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<1UL>_>._8_8_ = extraout_RDX;
  oVar2.super__Optional_base<supermap::ByteArray<1UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<1UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<1UL>_>._M_payload =
       (_Storage<supermap::ByteArray<1UL>,_false>)this;
  return (optional<supermap::ByteArray<1UL>_>)
         oVar2.super__Optional_base<supermap::ByteArray<1UL>,_false,_false>._M_payload.
         super__Optional_payload<supermap::ByteArray<1UL>,_true,_false,_false>.
         super__Optional_payload_base<supermap::ByteArray<1UL>_>;
}

Assistant:

std::optional<Value> getValue(const Key &key) override {
        return nestedStorages_[getShardIdForKey(key)]->getValue(key);
    }